

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::basic_string(spec *s)

{
  either *in_RDI;
  char_type in_stack_ffffffffffffff6f;
  character *in_stack_ffffffffffffff70;
  either *this;
  scanner_base in_stack_ffffffffffffff88;
  repeat_at_least *in_stack_ffffffffffffff90;
  character *in_stack_ffffffffffffff98;
  sequence *in_stack_ffffffffffffffa0;
  spec *in_stack_ffffffffffffffc8;
  
  character::character(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  basic_char(in_stack_ffffffffffffffc8);
  repeat_at_least::repeat_at_least<toml::detail::either>
            (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88._vptr_scanner_base,in_RDI);
  this = (either *)&stack0xffffffffffffff88;
  character::character((character *)this,in_stack_ffffffffffffff6f);
  sequence::sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::character>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (character *)in_stack_ffffffffffffff88._vptr_scanner_base);
  character::~character((character *)0x6d58b5);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either(this);
  character::~character((character *)0x6d58d3);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence basic_string(const spec& s)
{
    return sequence(
            character('"'),
            repeat_at_least(0, basic_char(s)),
            character('"')
        );
}